

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddAddPermuteRecur(DdManager *manager,DdHashTable *table,DdNode *node,int *permut)

{
  int iVar1;
  DdNode *g;
  DdNode *h;
  DdNode *f;
  ptrint fanout;
  int index;
  DdNode *var;
  DdNode *res;
  DdNode *E;
  DdNode *T;
  int *permut_local;
  DdNode *node_local;
  DdHashTable *table_local;
  DdManager *manager_local;
  
  manager_local = (DdManager *)node;
  if ((node->index != 0x7fffffff) &&
     ((node->ref == 1 ||
      (manager_local = (DdManager *)cuddHashTableLookup1(table,node),
      manager_local == (DdManager *)0x0)))) {
    g = cuddAddPermuteRecur(manager,table,(node->type).kids.T,permut);
    if (g == (DdNode *)0x0) {
      manager_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
      h = cuddAddPermuteRecur(manager,table,(node->type).kids.E,permut);
      if (h == (DdNode *)0x0) {
        Cudd_RecursiveDeref(manager,g);
        manager_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
        f = cuddUniqueInter(manager,permut[node->index],manager->one,manager->zero);
        if (f == (DdNode *)0x0) {
          manager_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) + 1;
          manager_local = (DdManager *)cuddAddIteRecur(manager,f,g,h);
          if (manager_local == (DdManager *)0x0) {
            Cudd_RecursiveDeref(manager,f);
            Cudd_RecursiveDeref(manager,g);
            Cudd_RecursiveDeref(manager,h);
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(manager,f);
            Cudd_RecursiveDeref(manager,g);
            Cudd_RecursiveDeref(manager,h);
            if ((node->ref == 1) ||
               (iVar1 = cuddHashTableInsert1
                                  (table,node,(DdNode *)manager_local,(ulong)node->ref - 1),
               iVar1 != 0)) {
              *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)manager_local & 0xfffffffffffffffe) + 4) + -1;
            }
            else {
              Cudd_RecursiveDeref(manager,(DdNode *)manager_local);
              manager_local = (DdManager *)0x0;
            }
          }
        }
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

static DdNode *
cuddAddPermuteRecur(
  DdManager * manager /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * node /* ADD to be reordered */,
  int * permut /* permutation array */)
{
    DdNode      *T,*E;
    DdNode      *res,*var;
    int         index;
    
    statLine(manager);
    /* Check for terminal case of constant node. */
    if (cuddIsConstant(node)) {
        return(node);
    }

    /* If problem already solved, look up answer and return. */
    if (node->ref != 1 && (res = cuddHashTableLookup1(table,node)) != NULL) {
#ifdef DD_DEBUG
        addPermuteRecurHits++;
#endif
        return(res);
    }

    /* Split and recur on children of this node. */
    T = cuddAddPermuteRecur(manager,table,cuddT(node),permut);
    if (T == NULL) return(NULL);
    cuddRef(T);
    E = cuddAddPermuteRecur(manager,table,cuddE(node),permut);
    if (E == NULL) {
        Cudd_RecursiveDeref(manager, T);
        return(NULL);
    }
    cuddRef(E);

    /* Move variable that should be in this position to this position
    ** by creating a single var ADD for that variable, and calling
    ** cuddAddIteRecur with the T and E we just created.
    */
    index = permut[node->index];
    var = cuddUniqueInter(manager,index,DD_ONE(manager),DD_ZERO(manager));
    if (var == NULL) return(NULL);
    cuddRef(var);
    res = cuddAddIteRecur(manager,var,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(manager,var);
        Cudd_RecursiveDeref(manager, T);
        Cudd_RecursiveDeref(manager, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(manager,var);
    Cudd_RecursiveDeref(manager, T);
    Cudd_RecursiveDeref(manager, E);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again.
    */
    if (node->ref != 1) {
        ptrint fanout = (ptrint) node->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,node,res,fanout)) {
            Cudd_RecursiveDeref(manager, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(res);

}